

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry>::~ArrayBuilder
          (ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)this;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)(this + 0x10);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    (**(code **)**(undefined8 **)(this + 0x18))
              (*(undefined8 **)(this + 0x18),lVar1,0x18,(lVar2 - lVar1 >> 3) * -0x5555555555555555,
               (lVar3 - lVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }